

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O1

void __thiscall
icu_63::SpoofImpl::setAllowedLocales(SpoofImpl *this,char *localesList,UErrorCode *status)

{
  UnicodeSet *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  SpoofImpl *pSVar5;
  char *pcVar6;
  UnicodeSet *pUVar7;
  char *pcVar8;
  UnicodeSet *pUVar9;
  SpoofImpl *pSVar10;
  UErrorCode *pUVar11;
  void *__child_stack;
  SpoofImpl *pSVar12;
  uint n;
  SpoofImpl *pSVar13;
  void *in_R8;
  int iVar14;
  UnicodeSet tempSet;
  UnicodeSet allowedChars;
  UnicodeSet local_e0;
  UnicodeSet local_88;
  undefined4 extraout_var;
  
  UnicodeSet::UnicodeSet(&local_88);
  sVar4 = strlen(localesList);
  iVar14 = 0;
  pSVar12 = (SpoofImpl *)localesList;
  do {
    pSVar5 = (SpoofImpl *)strchr((char *)pSVar12,0x2c);
    iVar2 = 1 - (int)pSVar12;
    do {
      iVar3 = iVar2;
      pSVar13 = pSVar12;
      pSVar12 = (SpoofImpl *)((long)&(pSVar13->super_UObject)._vptr_UObject + 1);
      iVar2 = iVar3 + -1;
    } while (*(char *)&(pSVar13->super_UObject)._vptr_UObject == ' ');
    if (pSVar5 == (SpoofImpl *)0x0) {
      pSVar5 = (SpoofImpl *)(localesList + sVar4);
    }
    pcVar8 = (char *)(ulong)(uint)(iVar3 + (int)pSVar5);
    pSVar10 = pSVar5;
    do {
      pSVar10 = (SpoofImpl *)&pSVar10[-1].field_0x2f;
      pSVar12 = pSVar13;
      if (pSVar10 <= pSVar13) goto LAB_001f2da1;
      n = (int)pcVar8 - 1;
      pcVar8 = (char *)(ulong)n;
    } while (*(char *)pSVar10 == ' ');
    if (pSVar13 < pSVar10) {
      pcVar6 = uprv_strndup_63((char *)pSVar13,n);
      pcVar8 = pcVar6;
      addScriptChars(pSVar13,pcVar6,&local_88,status);
      uprv_free_63(pcVar6);
      iVar14 = iVar14 + 1;
      bVar1 = *status < U_ILLEGAL_ARGUMENT_ERROR;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pSVar12 = (SpoofImpl *)((long)&(pSVar5->super_UObject)._vptr_UObject + 1);
      }
    }
    else {
LAB_001f2da1:
      bVar1 = false;
    }
    if ((!bVar1) || ((SpoofImpl *)(localesList + sVar4) <= pSVar12)) {
      if (iVar14 == 0) {
        uprv_free_63(this->fAllowedLocales);
        pcVar6 = uprv_strdup_63("");
        this->fAllowedLocales = pcVar6;
        pUVar9 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pcVar8);
        if (pUVar9 == (UnicodeSet *)0x0) {
          pUVar9 = (UnicodeSet *)0x0;
        }
        else {
          pcVar8 = (char *)0x0;
          UnicodeSet::UnicodeSet(pUVar9,0,0x10ffff);
        }
        if ((pUVar9 == (UnicodeSet *)0x0) || (this->fAllowedLocales == (char *)0x0)) {
          *status = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          UnicodeSet::freeze(pUVar9);
          pUVar7 = this->fAllowedCharsSet;
          if (pUVar7 != (UnicodeSet *)0x0) {
            UnicodeSet::~UnicodeSet(pUVar7);
            UMemory::operator_delete((UMemory *)pUVar7,pcVar8);
          }
          this->fAllowedCharsSet = pUVar9;
          *(byte *)&this->fChecks = (byte)this->fChecks & 0xbf;
        }
      }
      else {
        UnicodeSet::UnicodeSet(&local_e0);
        UnicodeSet::applyIntPropertyValue(&local_e0,UCHAR_SCRIPT,0,status);
        UnicodeSet::addAll(&local_88,&local_e0);
        pUVar11 = status;
        UnicodeSet::applyIntPropertyValue(&local_e0,UCHAR_SCRIPT,1,status);
        iVar14 = (int)pUVar11;
        pUVar9 = &local_e0;
        UnicodeSet::addAll(&local_88,pUVar9);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar14 = UnicodeSet::clone(&local_88,(__fn *)pUVar9,__child_stack,iVar14,in_R8);
          pUVar7 = (UnicodeSet *)CONCAT44(extraout_var,iVar14);
          pcVar8 = uprv_strdup_63(localesList);
          if (pcVar8 == (char *)0x0 || pUVar7 == (UnicodeSet *)0x0) {
            *status = U_MEMORY_ALLOCATION_ERROR;
          }
          else {
            uprv_free_63(this->fAllowedLocales);
            this->fAllowedLocales = pcVar8;
            UnicodeSet::freeze(pUVar7);
            this_00 = this->fAllowedCharsSet;
            if (this_00 != (UnicodeSet *)0x0) {
              UnicodeSet::~UnicodeSet(this_00);
              UMemory::operator_delete((UMemory *)this_00,pUVar9);
            }
            this->fAllowedCharsSet = pUVar7;
            *(byte *)&this->fChecks = (byte)this->fChecks | 0x40;
          }
        }
        UnicodeSet::~UnicodeSet(&local_e0);
      }
      UnicodeSet::~UnicodeSet(&local_88);
      return;
    }
  } while( true );
}

Assistant:

void SpoofImpl::setAllowedLocales(const char *localesList, UErrorCode &status) {
    UnicodeSet    allowedChars;
    UnicodeSet    *tmpSet = NULL;
    const char    *locStart = localesList;
    const char    *locEnd = NULL;
    const char    *localesListEnd = localesList + uprv_strlen(localesList);
    int32_t        localeListCount = 0;   // Number of locales provided by caller.

    // Loop runs once per locale from the localesList, a comma separated list of locales.
    do {
        locEnd = uprv_strchr(locStart, ',');
        if (locEnd == NULL) {
            locEnd = localesListEnd;
        }
        while (*locStart == ' ') {
            locStart++;
        }
        const char *trimmedEnd = locEnd-1;
        while (trimmedEnd > locStart && *trimmedEnd == ' ') {
            trimmedEnd--;
        }
        if (trimmedEnd <= locStart) {
            break;
        }
        const char *locale = uprv_strndup(locStart, (int32_t)(trimmedEnd + 1 - locStart));
        localeListCount++;

        // We have one locale from the locales list.
        // Add the script chars for this locale to the accumulating set of allowed chars.
        // If the locale is no good, we will be notified back via status.
        addScriptChars(locale, &allowedChars, status);
        uprv_free((void *)locale);
        if (U_FAILURE(status)) {
            break;
        }
        locStart = locEnd + 1;
    } while (locStart < localesListEnd);

    // If our caller provided an empty list of locales, we disable the allowed characters checking
    if (localeListCount == 0) {
        uprv_free((void *)fAllowedLocales);
        fAllowedLocales = uprv_strdup("");
        tmpSet = new UnicodeSet(0, 0x10ffff);
        if (fAllowedLocales == NULL || tmpSet == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        } 
        tmpSet->freeze();
        delete fAllowedCharsSet;
        fAllowedCharsSet = tmpSet;
        fChecks &= ~USPOOF_CHAR_LIMIT;
        return;
    }

        
    // Add all common and inherited characters to the set of allowed chars.
    UnicodeSet tempSet;
    tempSet.applyIntPropertyValue(UCHAR_SCRIPT, USCRIPT_COMMON, status);
    allowedChars.addAll(tempSet);
    tempSet.applyIntPropertyValue(UCHAR_SCRIPT, USCRIPT_INHERITED, status);
    allowedChars.addAll(tempSet);
    
    // If anything went wrong, we bail out without changing
    // the state of the spoof checker.
    if (U_FAILURE(status)) {
        return;
    }

    // Store the updated spoof checker state.
    tmpSet = static_cast<UnicodeSet *>(allowedChars.clone());
    const char *tmpLocalesList = uprv_strdup(localesList);
    if (tmpSet == NULL || tmpLocalesList == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    uprv_free((void *)fAllowedLocales);
    fAllowedLocales = tmpLocalesList;
    tmpSet->freeze();
    delete fAllowedCharsSet;
    fAllowedCharsSet = tmpSet;
    fChecks |= USPOOF_CHAR_LIMIT;
}